

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O0

QRect __thiscall QLabelPrivate::documentRect(QLabelPrivate *this)

{
  Int IVar1;
  int iVar2;
  QLabelPrivate *in_RDI;
  long in_FS_OFFSET;
  QRect QVar3;
  int m;
  int align;
  QLabel *q;
  QRect cr;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  LayoutDirection in_stack_ffffffffffffff90;
  QFlag in_stack_ffffffffffffff94;
  int in_stack_ffffffffffffff98;
  QFlagsStorage<Qt::AlignmentFlag> in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int local_50;
  QChar local_32;
  QFontMetrics local_30 [12];
  QFlag local_24 [2];
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_1c;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = (undefined1  [16])
             QWidget::contentsRect
                       ((QWidget *)CONCAT44(in_stack_ffffffffffffff9c.i,in_stack_ffffffffffffff98));
  QRect::adjust((QRect *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                in_stack_ffffffffffffff9c.i,in_stack_ffffffffffffff98,in_stack_ffffffffffffff94.i,
                in_stack_ffffffffffffff90);
  if ((*(ushort *)&in_RDI->field_0x340 >> 4 & 1) == 0) {
    QWidget::layoutDirection((QWidget *)0x5b3271);
  }
  else {
    textDirection((QLabelPrivate *)CONCAT44(in_stack_ffffffffffffff9c.i,in_stack_ffffffffffffff98));
  }
  QFlag::QFlag(local_24,in_RDI->align);
  QFlags<Qt::AlignmentFlag>::QFlagsStorageHelper
            ((QFlags<Qt::AlignmentFlag> *)
             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),in_stack_ffffffffffffff94
            );
  local_1c.super_QFlagsStorage<Qt::AlignmentFlag>.i =
       (QFlagsStorage<Qt::AlignmentFlag>)
       QStyle::visualAlignment(in_stack_ffffffffffffff90,(Alignment)in_stack_ffffffffffffff9c.i);
  IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_1c);
  local_50 = in_RDI->indent;
  if ((local_50 < 0) &&
     (iVar2 = QFrame::frameWidth((QFrame *)
                                 CONCAT44(in_stack_ffffffffffffff94.i,in_stack_ffffffffffffff90)),
     iVar2 != 0)) {
    QWidget::fontMetrics((QWidget *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    QChar::QChar<char16_t,_true>(&local_32,L'x');
    iVar2 = QFontMetrics::horizontalAdvance((QChar *)local_30);
    local_50 = iVar2 / 2 - in_RDI->margin;
    QFontMetrics::~QFontMetrics(local_30);
  }
  if (0 < local_50) {
    if ((IVar1 & 1) != 0) {
      QRect::left((QRect *)0x5b3355);
      QRect::setLeft((QRect *)CONCAT44(in_stack_ffffffffffffff94.i,in_stack_ffffffffffffff90),
                     in_stack_ffffffffffffff8c);
    }
    if ((IVar1 & 2) != 0) {
      QRect::right((QRect *)0x5b337b);
      QRect::setRight((QRect *)CONCAT44(in_stack_ffffffffffffff94.i,in_stack_ffffffffffffff90),
                      in_stack_ffffffffffffff8c);
    }
    if ((IVar1 & 0x20) != 0) {
      QRect::top((QRect *)0x5b33a1);
      QRect::setTop((QRect *)CONCAT44(in_stack_ffffffffffffff94.i,in_stack_ffffffffffffff90),
                    in_stack_ffffffffffffff8c);
    }
    if ((IVar1 & 0x40) != 0) {
      QRect::bottom((QRect *)0x5b33c7);
      QRect::setBottom((QRect *)CONCAT44(in_stack_ffffffffffffff94.i,in_stack_ffffffffffffff90),
                       in_stack_ffffffffffffff8c);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  QVar3.x1.m_i = local_18._0_4_;
  QVar3.y1.m_i = local_18._4_4_;
  QVar3.x2.m_i = local_18._8_4_;
  QVar3.y2.m_i = local_18._12_4_;
  return QVar3;
}

Assistant:

QRect QLabelPrivate::documentRect() const
{
    Q_Q(const QLabel);
    Q_ASSERT_X(isTextLabel, "documentRect", "document rect called for label that is not a text label!");
    QRect cr = q->contentsRect();
    cr.adjust(margin, margin, -margin, -margin);
    const int align = QStyle::visualAlignment(isTextLabel ? textDirection()
                                                          : q->layoutDirection(), QFlag(this->align));
    int m = indent;
    if (m < 0 && q->frameWidth()) // no indent, but we do have a frame
        m = q->fontMetrics().horizontalAdvance(u'x') / 2 - margin;
    if (m > 0) {
        if (align & Qt::AlignLeft)
            cr.setLeft(cr.left() + m);
        if (align & Qt::AlignRight)
            cr.setRight(cr.right() - m);
        if (align & Qt::AlignTop)
            cr.setTop(cr.top() + m);
        if (align & Qt::AlignBottom)
            cr.setBottom(cr.bottom() - m);
    }
    return cr;
}